

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionBody::PrintStatementSourceLineFromStartOffset(FunctionBody *this,uint cchStartOffset)

{
  Utf8SourceInfo *this_00;
  code *pcVar1;
  bool bVar2;
  WORD WVar3;
  BOOL BVar4;
  LPCUTF8 pch;
  undefined4 *puVar5;
  LPCUTF8 puVar6;
  undefined6 extraout_var;
  size_t sVar7;
  size_t sVar8;
  HeapAllocator *this_01;
  char16 *buffer;
  size_t sVar9;
  char16_t *pcVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 local_80 [8];
  TrackAllocData data;
  ULONG local_3c;
  int local_38;
  ULONG line;
  LONG col;
  
  pch = Utf8SourceInfo::GetSource
                  ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
                   L"FunctionBody::PrintStatementSourceLineFromStartOffset");
  this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  if (this_00 == (Utf8SourceInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x120a,"(sourceInfo != nullptr)","sourceInfo != nullptr");
    if (!bVar2) goto LAB_0076e16b;
    *puVar5 = 0;
  }
  puVar6 = Utf8SourceInfo::GetSource
                     (this_00,L"FunctionBody::PrintStatementSourceLineFromStartOffset");
  if (puVar6 == (LPCUTF8)0x0) {
    if ((this_00->field_0xa8 & 4) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x120e,"(sourceInfo->GetIsLibraryCode())",
                                  "sourceInfo->GetIsLibraryCode()");
      if (!bVar2) goto LAB_0076e16b;
      *puVar5 = 0;
    }
  }
  else {
    if (pch != puVar6) {
      Output::Print(L"\nDETECTED MISMATCH:\n");
      Output::Print(L"GetUtf8SourceInfo()->GetSource(): 0x%08X: %.*s ...\n",this_00,0x10,this_00);
      Output::Print(L"GetStartOfDocument():             0x%08X: %.*s ...\n",pch,0x10,pch);
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1217,"(false)","Non-matching start of document");
      if (!bVar2) goto LAB_0076e16b;
      *puVar5 = 0;
    }
    GetLineCharOffsetFromStartChar(this,cchStartOffset,&local_3c,&local_38,false);
    if ((this_00->sourceHolder).ptr == (ISourceHolder *)ISourceHolder::emptySourceHolder) {
      return;
    }
    if (DAT_015b0199 == '\x01') {
      WVar3 = Output::SetConsoleForeground(0xc);
      line = (ULONG)CONCAT62(extraout_var,WVar3);
    }
    else {
      line = 0;
    }
    Output::Print(L"\n\n  Line %3d: ");
    sVar7 = Utf8SourceInfo::GetCbLength(this_00,(char16 *)0x0);
    data._32_8_ = pch;
    sVar8 = utf8::CharacterIndexToByteIndex
                      (pch,sVar7,cchStartOffset,
                       (ulong)(this->super_ParseableFunctionInfo).m_cbStartOffset,
                       (this->super_ParseableFunctionInfo).m_cchStartOffset,doDefault);
    uVar11 = (ulong)((this->super_ParseableFunctionInfo).m_cbLength +
                    (this->super_ParseableFunctionInfo).m_cbStartOffset);
    uVar12 = uVar11 - sVar8;
    sVar7 = uVar12 + 2;
    local_80 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0x1227;
    data.plusSize = sVar7;
    this_01 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_80);
    sVar9 = 0xffffffffffffffff;
    if (-1 < (long)sVar7) {
      sVar9 = uVar12 * 2 + 4;
    }
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0076e16b;
      *puVar5 = 0;
    }
    buffer = (char16 *)Memory::HeapAllocator::AllocT<false>(this_01,sVar9);
    if (buffer == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_0076e16b;
      *puVar5 = 0;
    }
    sVar9 = utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                      (buffer,(LPCUTF8)(sVar8 + data._32_8_),(LPCUTF8)(uVar11 + data._32_8_),
                       doDefault,(bool *)0x0);
    if (uVar12 < sVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1229,"(utf16BufSz <= utf8SrcEndIdx - utf8SrcStartIdx)",
                                  "utf16BufSz <= utf8SrcEndIdx - utf8SrcStartIdx");
      if (!bVar2) {
LAB_0076e16b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (sVar9 != 0) {
      sVar8 = 0;
      do {
        if ((buffer[sVar8] == L'\r') || (buffer[sVar8] == L'\n')) break;
        Output::Print(L"%lc");
        sVar8 = sVar8 + 1;
      } while (sVar9 != sVar8);
    }
    Memory::DeleteArray<Memory::HeapAllocator,char16_t>
              (&Memory::HeapAllocator::Instance,sVar7,buffer);
    Output::Print(L"\n");
    pcVar10 = L"";
    if ((int)(local_38 + 1U) < 10000) {
      pcVar10 = L" ";
    }
    Output::Print(L"  Col %4d:%s^\n",(ulong)(local_38 + 1U),pcVar10);
    if ((WORD)line != 0) {
      Output::SetConsoleForeground((WORD)line);
    }
  }
  return;
}

Assistant:

void FunctionBody::PrintStatementSourceLineFromStartOffset(uint cchStartOffset)
    {
        ULONG line;
        LONG col;

        LPCUTF8 source = GetStartOfDocument(_u("FunctionBody::PrintStatementSourceLineFromStartOffset"));
        Utf8SourceInfo* sourceInfo = this->GetUtf8SourceInfo();
        Assert(sourceInfo != nullptr);
        LPCUTF8 sourceInfoSrc = sourceInfo->GetSource(_u("FunctionBody::PrintStatementSourceLineFromStartOffset"));
        if(!sourceInfoSrc)
        {
            Assert(sourceInfo->GetIsLibraryCode());
            return;
        }
        if( source != sourceInfoSrc )
        {
            Output::Print(_u("\nDETECTED MISMATCH:\n"));
            Output::Print(_u("GetUtf8SourceInfo()->GetSource(): 0x%08X: %.*s ...\n"), sourceInfo, 16, sourceInfo);
            Output::Print(_u("GetStartOfDocument():             0x%08X: %.*s ...\n"), source, 16, source);

            AssertMsg(false, "Non-matching start of document");
        }

        GetLineCharOffsetFromStartChar(cchStartOffset, &line, &col, false /*canAllocateLineCache*/);

        if (sourceInfo->GetSourceHolder() != ISourceHolder::GetEmptySourceHolder())
        {
            WORD color = 0;
            if (Js::Configuration::Global.flags.DumpLineNoInColor)
            {
                color = Output::SetConsoleForeground(12);
            }
            Output::Print(_u("\n\n  Line %3d: "), line + 1);
            // Need to match up cchStartOffset to appropriate cbStartOffset given function's cbStartOffset and cchStartOffset
            size_t utf8SrcStartIdx = utf8::CharacterIndexToByteIndex(source, sourceInfo->GetCbLength(), cchStartOffset, this->m_cbStartOffset, this->m_cchStartOffset);
            size_t utf8SrcEndIdx = StartOffset() + LengthInBytes();
            char16* utf16Buf = HeapNewArray(char16, utf8SrcEndIdx - utf8SrcStartIdx + 2); 
            size_t utf16BufSz = utf8::DecodeUnitsIntoAndNullTerminateNoAdvance(utf16Buf, source + utf8SrcStartIdx, source + utf8SrcEndIdx, utf8::DecodeOptions::doDefault);
            Assert(utf16BufSz <= utf8SrcEndIdx - utf8SrcStartIdx);
            for (size_t i = 0; i < utf16BufSz && utf16Buf[i] != _u('\n') && utf16Buf[i] != _u('\r'); i++)
            {
                Output::Print(_u("%lc"), utf16Buf[i]);
            }
            HeapDeleteArray(utf8SrcEndIdx - utf8SrcStartIdx + 2, utf16Buf);
            Output::Print(_u("\n"));
            Output::Print(_u("  Col %4d:%s^\n"), col + 1, ((col+1)<10000) ? _u(" ") : _u(""));

            if (color != 0)
            {
                Output::SetConsoleForeground(color);
            }
        }
    }